

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined4 uVar21;
  Ref<embree::Geometry> *pRVar22;
  Geometry *pGVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  RTCFilterFunctionN p_Var32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  bool bVar56;
  AABBNodeMB4D *node1;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  ulong uVar60;
  uint uVar61;
  undefined1 *puVar62;
  ulong uVar63;
  undefined1 *extraout_RDX;
  undefined1 *extraout_RDX_00;
  undefined1 *extraout_RDX_01;
  undefined1 *extraout_RDX_02;
  ulong uVar64;
  ulong uVar65;
  Scene *pSVar66;
  int iVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  long lVar75;
  size_t sVar76;
  ulong uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar113;
  float fVar116;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar122;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  float fVar163;
  float fVar164;
  int iVar165;
  float fVar166;
  float fVar167;
  int iVar168;
  float fVar169;
  float fVar170;
  int iVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  uint uVar175;
  float fVar176;
  uint uVar177;
  float fVar178;
  uint uVar179;
  float fVar180;
  uint uVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  NodeRef *local_c10;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  undefined8 local_bf8;
  float fStack_be0;
  float fStack_bdc;
  undefined8 local_bd8;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bb0;
  float fStack_bac;
  undefined1 local_ba8 [16];
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  float fStack_b80;
  float fStack_b7c;
  undefined8 local_b78;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  float fStack_b34;
  float fStack_b24;
  float fStack_b14;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_ae0;
  float fStack_adc;
  undefined8 local_ad8;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a1c;
  float fStack_a0c;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  float local_968 [4];
  undefined1 local_958 [8];
  float fStack_950;
  float fStack_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined1 local_938 [8];
  float fStack_930;
  float fStack_92c;
  undefined1 local_928 [16];
  RTCHitN local_918 [16];
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  undefined1 local_888 [16];
  undefined8 local_878;
  undefined8 uStack_870;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_858;
  int iStack_854;
  int iStack_850;
  int iStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  local_c10 = stack + 1;
  stack[0] = root;
  fVar78 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar188 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar80 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar79 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar77 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar67 = (tray->tnear).field_0.i[k];
  iVar162 = (tray->tfar).field_0.i[k];
  local_878 = mm_lookupmask_ps._0_8_;
  uStack_870 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  puVar62 = mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10;
  bVar56 = true;
  local_7f8 = fVar78;
  fStack_7f4 = fVar78;
  fStack_7f0 = fVar78;
  fStack_7ec = fVar78;
  local_808 = fVar188;
  fStack_804 = fVar188;
  fStack_800 = fVar188;
  fStack_7fc = fVar188;
  local_818 = fVar80;
  fStack_814 = fVar80;
  fStack_810 = fVar80;
  fStack_80c = fVar80;
  local_828 = fVar85;
  fStack_824 = fVar85;
  fStack_820 = fVar85;
  fStack_81c = fVar85;
  local_838 = fVar86;
  fStack_834 = fVar86;
  fStack_830 = fVar86;
  fStack_82c = fVar86;
  local_848 = fVar79;
  fStack_844 = fVar79;
  fStack_840 = fVar79;
  fStack_83c = fVar79;
  local_858 = iVar67;
  iStack_854 = iVar67;
  iStack_850 = iVar67;
  iStack_84c = iVar67;
  local_868 = iVar162;
  iStack_864 = iVar162;
  iStack_860 = iVar162;
  iStack_85c = iVar162;
  local_bf8 = k;
  fVar87 = fVar78;
  fVar95 = fVar78;
  fVar101 = fVar78;
  fVar104 = fVar188;
  fVar113 = fVar188;
  fVar102 = fVar188;
  fVar116 = fVar80;
  fVar103 = fVar80;
  fVar119 = fVar80;
  fVar105 = fVar86;
  fVar106 = fVar86;
  fVar114 = fVar86;
  fVar115 = fVar79;
  fVar117 = fVar79;
  fVar118 = fVar79;
  iVar159 = iVar67;
  iVar160 = iVar67;
  iVar161 = iVar67;
  iVar165 = iVar162;
  iVar168 = iVar162;
  iVar171 = iVar162;
  fVar120 = fVar85;
  fVar121 = fVar85;
  fVar122 = fVar85;
  do {
    sVar76 = local_c10[-1].ptr;
    local_c10 = local_c10 + -1;
    while ((sVar76 & 8) == 0) {
      uVar57 = sVar76 & 0xfffffffffffffff0;
      fVar126 = *(float *)(ray + local_bf8 * 4 + 0x70);
      pfVar20 = (float *)(uVar57 + 0x80 + uVar72);
      pfVar19 = (float *)(uVar57 + 0x20 + uVar72);
      auVar96._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar78) * fVar85;
      auVar96._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar87) * fVar120;
      auVar96._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar95) * fVar121;
      auVar96._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar101) * fVar122;
      auVar88._4_4_ = iVar159;
      auVar88._0_4_ = iVar67;
      auVar88._8_4_ = iVar160;
      auVar88._12_4_ = iVar161;
      auVar88 = maxps(auVar88,auVar96);
      pfVar20 = (float *)(uVar57 + 0x80 + uVar64);
      pfVar19 = (float *)(uVar57 + 0x20 + uVar64);
      auVar110._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar188) * fVar86;
      auVar110._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar104) * fVar105;
      auVar110._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar113) * fVar106;
      auVar110._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar102) * fVar114;
      pfVar20 = (float *)(uVar57 + 0x80 + uVar77);
      pfVar19 = (float *)(uVar57 + 0x20 + uVar77);
      auVar107._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar80) * fVar79;
      auVar107._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar116) * fVar115;
      auVar107._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar103) * fVar117;
      auVar107._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar119) * fVar118;
      auVar96 = maxps(auVar110,auVar107);
      auVar88 = maxps(auVar88,auVar96);
      pfVar20 = (float *)(uVar57 + 0x80 + (uVar72 ^ 0x10));
      pfVar19 = (float *)(uVar57 + 0x20 + (uVar72 ^ 0x10));
      auVar108._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar78) * fVar85;
      auVar108._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar87) * fVar120;
      auVar108._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar95) * fVar121;
      auVar108._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar101) * fVar122;
      auVar97._4_4_ = iVar165;
      auVar97._0_4_ = iVar162;
      auVar97._8_4_ = iVar168;
      auVar97._12_4_ = iVar171;
      auVar96 = minps(auVar97,auVar108);
      pfVar20 = (float *)(uVar57 + 0x80 + (uVar64 ^ 0x10));
      pfVar19 = (float *)(uVar57 + 0x20 + (uVar64 ^ 0x10));
      auVar109._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar188) * fVar86;
      auVar109._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar104) * fVar105;
      auVar109._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar113) * fVar106;
      auVar109._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar102) * fVar114;
      pfVar20 = (float *)(uVar57 + 0x80 + (uVar77 ^ 0x10));
      pfVar19 = (float *)(uVar57 + 0x20 + (uVar77 ^ 0x10));
      auVar123._0_4_ = ((*pfVar20 * fVar126 + *pfVar19) - fVar80) * fVar79;
      auVar123._4_4_ = ((pfVar20[1] * fVar126 + pfVar19[1]) - fVar116) * fVar115;
      auVar123._8_4_ = ((pfVar20[2] * fVar126 + pfVar19[2]) - fVar103) * fVar117;
      auVar123._12_4_ = ((pfVar20[3] * fVar126 + pfVar19[3]) - fVar119) * fVar118;
      auVar110 = minps(auVar109,auVar123);
      auVar96 = minps(auVar96,auVar110);
      bVar37 = auVar88._0_4_ <= auVar96._0_4_;
      bVar38 = auVar88._4_4_ <= auVar96._4_4_;
      bVar39 = auVar88._8_4_ <= auVar96._8_4_;
      bVar40 = auVar88._12_4_ <= auVar96._12_4_;
      if (((uint)sVar76 & 7) == 6) {
        bVar37 = (fVar126 < *(float *)(uVar57 + 0xf0) && *(float *)(uVar57 + 0xe0) <= fVar126) &&
                 bVar37;
        bVar38 = (fVar126 < *(float *)(uVar57 + 0xf4) && *(float *)(uVar57 + 0xe4) <= fVar126) &&
                 bVar38;
        bVar39 = (fVar126 < *(float *)(uVar57 + 0xf8) && *(float *)(uVar57 + 0xe8) <= fVar126) &&
                 bVar39;
        bVar40 = (fVar126 < *(float *)(uVar57 + 0xfc) && *(float *)(uVar57 + 0xec) <= fVar126) &&
                 bVar40;
      }
      auVar89._0_4_ = (uint)bVar37 * -0x80000000;
      auVar89._4_4_ = (uint)bVar38 * -0x80000000;
      auVar89._8_4_ = (uint)bVar39 * -0x80000000;
      auVar89._12_4_ = (uint)bVar40 * -0x80000000;
      uVar61 = movmskps((int)puVar62,auVar89);
      puVar62 = (undefined1 *)(ulong)uVar61;
      if (uVar61 == 0) goto joined_r0x00281922;
      lVar58 = 0;
      if ((byte)uVar61 != 0) {
        for (; ((byte)uVar61 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
        }
      }
      sVar76 = *(size_t *)(uVar57 + lVar58 * 8);
      uVar61 = (uVar61 & 0xff) - 1 & uVar61 & 0xff;
      puVar62 = (undefined1 *)(ulong)uVar61;
      if (uVar61 != 0) {
        local_c10->ptr = sVar76;
        local_c10 = local_c10 + 1;
        lVar58 = 0;
        if (puVar62 != (undefined1 *)0x0) {
          for (; (uVar61 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
          }
        }
        sVar76 = *(size_t *)(uVar57 + lVar58 * 8);
        uVar61 = uVar61 - 1 & uVar61;
        uVar68 = (ulong)uVar61;
        if (uVar61 != 0) {
          do {
            local_c10->ptr = sVar76;
            local_c10 = local_c10 + 1;
            puVar62 = (undefined1 *)0x0;
            if (uVar68 != 0) {
              for (; (uVar68 >> (long)puVar62 & 1) == 0; puVar62 = puVar62 + 1) {
              }
            }
            sVar76 = *(size_t *)(uVar57 + (long)puVar62 * 8);
            uVar68 = uVar68 & uVar68 - 1;
          } while (uVar68 != 0);
        }
      }
    }
    uVar57 = (ulong)((uint)sVar76 & 0xf);
    fVar78 = local_7f8;
    fVar87 = fStack_7f4;
    fVar95 = fStack_7f0;
    fVar101 = fStack_7ec;
    fVar188 = local_808;
    fVar104 = fStack_804;
    fVar113 = fStack_800;
    fVar102 = fStack_7fc;
    fVar80 = local_818;
    fVar116 = fStack_814;
    fVar103 = fStack_810;
    fVar119 = fStack_80c;
    fVar86 = local_838;
    fVar105 = fStack_834;
    fVar106 = fStack_830;
    fVar114 = fStack_82c;
    fVar79 = local_848;
    fVar115 = fStack_844;
    fVar117 = fStack_840;
    fVar118 = fStack_83c;
    iVar67 = local_858;
    iVar159 = iStack_854;
    iVar160 = iStack_850;
    iVar161 = iStack_84c;
    iVar162 = local_868;
    iVar165 = iStack_864;
    iVar168 = iStack_860;
    iVar171 = iStack_85c;
    fVar85 = local_828;
    fVar120 = fStack_824;
    fVar121 = fStack_820;
    fVar122 = fStack_81c;
    if (uVar57 != 8) {
      uVar68 = sVar76 & 0xfffffffffffffff0;
      lVar58 = 0;
      do {
        lVar73 = lVar58 * 0x60;
        pSVar66 = context->scene;
        pRVar22 = (pSVar66->geometries).items;
        pGVar23 = pRVar22[*(uint *)(uVar68 + 0x40 + lVar73)].ptr;
        fVar78 = (pGVar23->time_range).lower;
        fVar188 = ((*(float *)(ray + local_bf8 * 4 + 0x70) - fVar78) /
                  ((pGVar23->time_range).upper - fVar78)) * pGVar23->fnumTimeSegments;
        auVar90 = roundss(ZEXT416((uint)fVar78),ZEXT416((uint)fVar188),9);
        fVar78 = pGVar23->fnumTimeSegments + -1.0;
        if (fVar78 <= auVar90._0_4_) {
          auVar90._0_4_ = fVar78;
        }
        fVar78 = 0.0;
        if (0.0 <= auVar90._0_4_) {
          fVar78 = auVar90._0_4_;
        }
        fVar188 = fVar188 - fVar78;
        lVar75 = (long)(int)fVar78 * 0x38;
        lVar24 = *(long *)(*(long *)&pGVar23[2].numPrimitives + lVar75);
        uVar70 = (ulong)*(uint *)(uVar68 + 4 + lVar73);
        pfVar19 = (float *)(lVar24 + (ulong)*(uint *)(uVar68 + lVar73) * 4);
        uVar71 = (ulong)*(uint *)(uVar68 + 0x10 + lVar73);
        pfVar20 = (float *)(lVar24 + uVar71 * 4);
        uVar59 = (ulong)*(uint *)(uVar68 + 0x30 + lVar73);
        pfVar1 = (float *)(lVar24 + uVar59 * 4);
        lVar25 = *(long *)&pRVar22[*(uint *)(uVar68 + 0x44 + lVar73)].ptr[2].numPrimitives;
        lVar26 = *(long *)(lVar25 + lVar75);
        pfVar2 = (float *)(lVar26 + uVar70 * 4);
        uVar74 = (ulong)*(uint *)(uVar68 + 0x14 + lVar73);
        pfVar3 = (float *)(lVar26 + uVar74 * 4);
        lVar69 = (long)((int)fVar78 + 1) * 0x38;
        lVar27 = *(long *)(*(long *)&pGVar23[2].numPrimitives + lVar69);
        pfVar4 = (float *)(lVar27 + (ulong)*(uint *)(uVar68 + lVar73) * 4);
        pfVar5 = (float *)(lVar26 + (ulong)*(uint *)(uVar68 + 0x34 + lVar73) * 4);
        lVar28 = *(long *)&pRVar22[*(uint *)(uVar68 + 0x48 + lVar73)].ptr[2].numPrimitives;
        puVar6 = (undefined8 *)(lVar27 + uVar71 * 4);
        uVar44 = *puVar6;
        uVar45 = puVar6[1];
        lVar29 = *(long *)(lVar28 + lVar75);
        lVar30 = *(long *)(lVar25 + lVar69);
        pfVar7 = (float *)(lVar30 + uVar70 * 4);
        uVar71 = (ulong)*(uint *)(uVar68 + 8 + lVar73);
        lVar25 = lVar29 + uVar71 * 4;
        lVar31 = *(long *)(lVar28 + lVar69);
        pfVar8 = (float *)(lVar31 + uVar71 * 4);
        uVar65 = (ulong)*(uint *)(uVar68 + 0x18 + lVar73);
        lVar28 = *(long *)&pRVar22[*(uint *)(uVar68 + 0x4c + lVar73)].ptr[2].numPrimitives;
        lVar75 = *(long *)(lVar28 + lVar75);
        uVar71 = *(ulong *)(lVar28 + lVar69);
        uVar60 = (ulong)*(uint *)(uVar68 + 0x38 + lVar73);
        pfVar9 = (float *)(lVar29 + uVar60 * 4);
        uVar70 = (ulong)*(uint *)(uVar68 + 0xc + lVar73);
        lVar28 = lVar75 + uVar70 * 4;
        uVar63 = (ulong)*(uint *)(uVar68 + 0x1c + lVar73);
        local_ad8 = CONCAT44(*(undefined4 *)(lVar28 + 8),*(undefined4 *)(lVar25 + 8));
        uVar61 = *(uint *)(uVar68 + 0x3c + lVar73);
        pfVar10 = (float *)(lVar75 + (ulong)uVar61 * 4);
        pfVar11 = (float *)(uVar71 + uVar70 * 4);
        local_b78 = (undefined1 (*) [16])CONCAT44(pfVar10[2],pfVar9[2]);
        pfVar12 = (float *)(lVar31 + uVar65 * 4);
        local_c08 = (float)uVar44;
        fStack_c04 = (float)((ulong)uVar44 >> 0x20);
        fStack_c00 = (float)uVar45;
        pfVar13 = (float *)(lVar30 + uVar74 * 4);
        pfVar14 = (float *)(uVar71 + uVar63 * 4);
        local_bf8 = CONCAT44(pfVar14[2],pfVar12[2]);
        pfVar15 = (float *)(lVar27 + uVar59 * 4);
        pfVar16 = (float *)(lVar31 + uVar60 * 4);
        pfVar17 = (float *)(lVar30 + local_ad8 * 4);
        pfVar18 = (float *)(uVar71 + (ulong)uVar61 * 4);
        fVar79 = 1.0 - fVar188;
        fVar163 = *pfVar19 * fVar79 + *pfVar4 * fVar188;
        fVar166 = *pfVar2 * fVar79 + *pfVar7 * fVar188;
        fVar169 = fStack_be0 * fVar79 + *pfVar8 * fVar188;
        fVar172 = fStack_bdc * fVar79 + *pfVar11 * fVar188;
        local_7e8 = pfVar19[1] * fVar79 + pfVar4[1] * fVar188;
        fStack_7e4 = pfVar2[1] * fVar79 + pfVar7[1] * fVar188;
        fStack_7e0 = *(float *)(lVar25 + 4) * fVar79 + pfVar8[1] * fVar188;
        fStack_7dc = *(float *)(lVar28 + 4) * fVar79 + pfVar11[1] * fVar188;
        fVar104 = pfVar19[2] * fVar79 + pfVar4[2] * fVar188;
        fVar113 = pfVar2[2] * fVar79 + pfVar7[2] * fVar188;
        fVar116 = fStack_ae0 * fVar79 + pfVar8[2] * fVar188;
        fVar119 = fStack_adc * fVar79 + pfVar11[2] * fVar188;
        fVar182 = *pfVar20 * fVar79 + local_c08 * fVar188;
        fVar184 = *pfVar3 * fVar79 + *pfVar13 * fVar188;
        fStack_bb0 = fStack_bb0 * fVar79 + *pfVar12 * fVar188;
        fStack_bac = fStack_bac * fVar79 + *pfVar14 * fVar188;
        fStack_bfc = (float)((ulong)uVar45 >> 0x20);
        fVar147 = pfVar20[1] * fVar79 + fStack_c04 * fVar188;
        fVar150 = pfVar3[1] * fVar79 + pfVar13[1] * fVar188;
        fVar153 = *(float *)(lVar29 + uVar65 * 4 + 4) * fVar79 + pfVar12[1] * fVar188;
        fVar156 = *(float *)(lVar75 + uVar63 * 4 + 4) * fVar79 + pfVar14[1] * fVar188;
        fVar105 = pfVar20[2] * fVar79 + fStack_c00 * fVar188;
        fVar114 = pfVar3[2] * fVar79 + pfVar13[2] * fVar188;
        fVar117 = fStack_bd0 * fVar79 + fStack_c00 * fVar188;
        fVar120 = fStack_bcc * fVar79 + fStack_bfc * fVar188;
        fVar122 = *pfVar1 * fVar79 + *pfVar15 * fVar188;
        fVar126 = *pfVar5 * fVar79 + *pfVar17 * fVar188;
        fVar127 = *pfVar9 * fVar79 + *pfVar16 * fVar188;
        fVar128 = *pfVar10 * fVar79 + *pfVar18 * fVar188;
        fVar95 = pfVar1[1] * fVar79 + pfVar15[1] * fVar188;
        fVar101 = pfVar5[1] * fVar79 + pfVar17[1] * fVar188;
        fVar102 = pfVar9[1] * fVar79 + pfVar16[1] * fVar188;
        fVar103 = pfVar10[1] * fVar79 + pfVar18[1] * fVar188;
        local_b88._0_4_ = pfVar1[2] * fVar79 + pfVar15[2] * fVar188;
        local_b88._4_4_ = pfVar5[2] * fVar79 + pfVar17[2] * fVar188;
        fStack_b80 = fStack_b80 * fVar79 + pfVar16[2] * fVar188;
        fStack_b7c = fStack_b7c * fVar79 + pfVar18[2] * fVar188;
        fVar133 = local_7e8 - fVar147;
        fVar134 = fStack_7e4 - fVar150;
        fVar135 = fStack_7e0 - fVar153;
        fVar136 = fStack_7dc - fVar156;
        fVar143 = fVar104 - fVar105;
        fVar144 = fVar113 - fVar114;
        fVar145 = fVar116 - fVar117;
        fVar146 = fVar119 - fVar120;
        fVar174 = fVar95 - local_7e8;
        fVar176 = fVar101 - fStack_7e4;
        fVar178 = fVar102 - fStack_7e0;
        fVar180 = fVar103 - fStack_7dc;
        fVar189 = (float)local_b88 - fVar104;
        fVar190 = local_b88._4_4_ - fVar113;
        fVar191 = fStack_b80 - fVar116;
        fVar192 = fStack_b7c - fVar119;
        fVar148 = fVar143 * fVar174 - fVar133 * fVar189;
        fVar151 = fVar144 * fVar176 - fVar134 * fVar190;
        fVar154 = fVar145 * fVar178 - fVar135 * fVar191;
        fVar157 = fVar146 * fVar180 - fVar136 * fVar192;
        fVar137 = fVar122 - fVar163;
        fVar140 = fVar126 - fVar166;
        fVar141 = fVar127 - fVar169;
        fVar142 = fVar128 - fVar172;
        fStack_b14 = *(float *)(ray + local_bf8 * 4);
        fStack_b24 = *(float *)(ray + local_bf8 * 4 + 0x10);
        fStack_a0c = *(float *)(ray + local_bf8 * 4 + 0x40);
        fStack_a1c = *(float *)(ray + local_bf8 * 4 + 0x50);
        fVar164 = fVar163 - fStack_b14;
        fVar167 = fVar166 - fStack_b14;
        fVar170 = fVar169 - fStack_b14;
        fVar173 = fVar172 - fStack_b14;
        local_7e8 = local_7e8 - fStack_b24;
        fStack_7e4 = fStack_7e4 - fStack_b24;
        fStack_7e0 = fStack_7e0 - fStack_b24;
        fStack_7dc = fStack_7dc - fStack_b24;
        fVar106 = fVar164 * fStack_a1c - local_7e8 * fStack_a0c;
        fVar115 = fVar167 * fStack_a1c - fStack_7e4 * fStack_a0c;
        fVar118 = fVar170 * fStack_a1c - fStack_7e0 * fStack_a0c;
        fVar121 = fVar173 * fStack_a1c - fStack_7dc * fStack_a0c;
        fVar163 = fVar163 - fVar182;
        fVar166 = fVar166 - fVar184;
        fVar169 = fVar169 - fStack_bb0;
        fVar172 = fVar172 - fStack_bac;
        fVar129 = fVar163 * fVar189 - fVar143 * fVar137;
        fVar130 = fVar166 * fVar190 - fVar144 * fVar140;
        fVar131 = fVar169 * fVar191 - fVar145 * fVar141;
        fVar132 = fVar172 * fVar192 - fVar146 * fVar142;
        fStack_b34 = *(float *)(ray + local_bf8 * 4 + 0x20);
        fVar78 = *(float *)(ray + local_bf8 * 4 + 0x60);
        fVar104 = fVar104 - fStack_b34;
        fVar113 = fVar113 - fStack_b34;
        fVar116 = fVar116 - fStack_b34;
        fVar119 = fVar119 - fStack_b34;
        fVar80 = fVar104 * fStack_a0c - fVar164 * fVar78;
        fVar85 = fVar113 * fStack_a0c - fVar167 * fVar78;
        fVar86 = fVar116 * fStack_a0c - fVar170 * fVar78;
        fVar87 = fVar119 * fStack_a0c - fVar173 * fVar78;
        local_938._0_4_ = fVar133 * fVar137 - fVar163 * fVar174;
        local_938._4_4_ = fVar134 * fVar140 - fVar166 * fVar176;
        fStack_930 = fVar135 * fVar141 - fVar169 * fVar178;
        fStack_92c = fVar136 * fVar142 - fVar172 * fVar180;
        fVar183 = local_7e8 * fVar78 - fVar104 * fStack_a1c;
        fVar185 = fStack_7e4 * fVar78 - fVar113 * fStack_a1c;
        fVar186 = fStack_7e0 * fVar78 - fVar116 * fStack_a1c;
        fVar187 = fStack_7dc * fVar78 - fVar119 * fStack_a1c;
        fVar149 = fVar148 * fStack_a0c + fVar129 * fStack_a1c + (float)local_938._0_4_ * fVar78;
        fVar152 = fVar151 * fStack_a0c + fVar130 * fStack_a1c + (float)local_938._4_4_ * fVar78;
        fVar155 = fVar154 * fStack_a0c + fVar131 * fStack_a1c + fStack_930 * fVar78;
        fVar158 = fVar157 * fStack_a0c + fVar132 * fStack_a1c + fStack_92c * fVar78;
        uVar175 = (uint)fVar149 & 0x80000000;
        uVar177 = (uint)fVar152 & 0x80000000;
        uVar179 = (uint)fVar155 & 0x80000000;
        uVar181 = (uint)fVar158 & 0x80000000;
        fVar137 = (float)((uint)(fVar137 * fVar183 + fVar174 * fVar80 + fVar189 * fVar106) ^ uVar175
                         );
        fVar140 = (float)((uint)(fVar140 * fVar185 + fVar176 * fVar85 + fVar190 * fVar115) ^ uVar177
                         );
        fVar141 = (float)((uint)(fVar141 * fVar186 + fVar178 * fVar86 + fVar191 * fVar118) ^ uVar179
                         );
        fVar142 = (float)((uint)(fVar142 * fVar187 + fVar180 * fVar87 + fVar192 * fVar121) ^ uVar181
                         );
        fVar133 = (float)((uint)(fVar183 * fVar163 + fVar80 * fVar133 + fVar106 * fVar143) ^ uVar175
                         );
        fVar134 = (float)((uint)(fVar185 * fVar166 + fVar85 * fVar134 + fVar115 * fVar144) ^ uVar177
                         );
        fVar135 = (float)((uint)(fVar186 * fVar169 + fVar86 * fVar135 + fVar118 * fVar145) ^ uVar179
                         );
        fVar121 = (float)((uint)(fVar187 * fVar172 + fVar87 * fVar136 + fVar121 * fVar146) ^ uVar181
                         );
        fVar87 = ABS(fVar149);
        fVar106 = ABS(fVar152);
        fVar115 = ABS(fVar155);
        fVar118 = ABS(fVar158);
        bVar38 = ((0.0 <= fVar133 && 0.0 <= fVar137) && fVar149 != 0.0) &&
                 fVar137 + fVar133 <= fVar87;
        auVar111._0_4_ = -(uint)bVar38;
        bVar40 = ((0.0 <= fVar134 && 0.0 <= fVar140) && fVar152 != 0.0) &&
                 fVar140 + fVar134 <= fVar106;
        auVar111._4_4_ = -(uint)bVar40;
        bVar39 = ((0.0 <= fVar135 && 0.0 <= fVar141) && fVar155 != 0.0) &&
                 fVar141 + fVar135 <= fVar115;
        auVar111._8_4_ = -(uint)bVar39;
        bVar37 = ((0.0 <= fVar121 && 0.0 <= fVar142) && fVar158 != 0.0) &&
                 fVar142 + fVar121 <= fVar118;
        auVar111._12_4_ = -(uint)bVar37;
        lVar25 = uVar68 + lVar73;
        uVar70 = (ulong)*(uint *)(uVar68 + 0x20 + lVar73);
        puVar62 = (undefined1 *)(ulong)*(uint *)(uVar68 + 0x24 + lVar73);
        uVar59 = (ulong)*(uint *)(uVar68 + 0x28 + lVar73);
        uVar60 = (ulong)*(uint *)(uVar68 + 0x2c + lVar73);
        iVar67 = movmskps(uVar61,auVar111);
        pfVar19 = (float *)(lVar24 + uVar70 * 4);
        local_b98 = *pfVar19;
        fStack_b94 = pfVar19[1];
        fStack_b90 = pfVar19[2];
        fStack_b8c = pfVar19[3];
        pfVar19 = (float *)(lVar27 + uVar70 * 4);
        fVar80 = *pfVar19;
        fVar85 = pfVar19[1];
        fVar86 = pfVar19[2];
        puVar6 = (undefined8 *)(lVar26 + (long)puVar62 * 4);
        uVar44 = *puVar6;
        uVar45 = puVar6[1];
        puVar6 = (undefined8 *)(lVar30 + (long)puVar62 * 4);
        uVar46 = *puVar6;
        uVar47 = puVar6[1];
        puVar6 = (undefined8 *)(lVar29 + uVar59 * 4);
        uVar48 = *puVar6;
        uVar49 = puVar6[1];
        puVar6 = (undefined8 *)(lVar31 + uVar59 * 4);
        uVar50 = *puVar6;
        uVar51 = puVar6[1];
        puVar6 = (undefined8 *)(lVar75 + uVar60 * 4);
        uVar52 = *puVar6;
        uVar53 = puVar6[1];
        puVar6 = (undefined8 *)(uVar71 + uVar60 * 4);
        uVar54 = *puVar6;
        uVar55 = puVar6[1];
        scene = pSVar66;
        if (iVar67 != 0) {
          fVar136 = (float)(uVar175 ^
                           (uint)(fVar164 * fVar148 +
                                 local_7e8 * fVar129 + fVar104 * (float)local_938._0_4_));
          fVar113 = (float)(uVar177 ^
                           (uint)(fVar167 * fVar151 +
                                 fStack_7e4 * fVar130 + fVar113 * (float)local_938._4_4_));
          fVar116 = (float)(uVar179 ^
                           (uint)(fVar170 * fVar154 + fStack_7e0 * fVar131 + fVar116 * fStack_930));
          fVar119 = (float)(uVar181 ^
                           (uint)(fVar173 * fVar157 + fStack_7dc * fVar132 + fVar119 * fStack_92c));
          fVar104 = *(float *)(ray + local_bf8 * 4 + 0x30);
          bVar33 = fVar104 * fVar87 < fVar136;
          bVar34 = fVar104 * fVar106 < fVar113;
          bVar35 = fVar104 * fVar115 < fVar116;
          bVar36 = fVar104 * fVar118 < fVar119;
          auVar98._4_4_ = -(uint)bVar34;
          auVar98._0_4_ = -(uint)bVar33;
          auVar98._8_4_ = -(uint)bVar35;
          auVar98._12_4_ = -(uint)bVar36;
          fVar104 = *(float *)(ray + local_bf8 * 4 + 0x80);
          auVar81._0_4_ = -(uint)((fVar136 <= fVar104 * fVar87 && bVar33) && bVar38);
          auVar81._4_4_ = -(uint)((fVar113 <= fVar104 * fVar106 && bVar34) && bVar40);
          auVar81._8_4_ = -(uint)((fVar116 <= fVar104 * fVar115 && bVar35) && bVar39);
          auVar81._12_4_ = -(uint)((fVar119 <= fVar104 * fVar118 && bVar36) && bVar37);
          uVar61 = movmskps((int)uVar71,auVar81);
          uVar71 = (ulong)uVar61;
          if (uVar61 != 0) {
            local_958._4_4_ = fVar151;
            local_958._0_4_ = fVar148;
            fStack_950 = fVar154;
            fStack_94c = fVar157;
            local_928._8_8_ = uStack_870;
            local_928._0_8_ = local_878;
            auVar43._4_4_ = fVar106;
            auVar43._0_4_ = fVar87;
            auVar43._8_4_ = fVar115;
            auVar43._12_4_ = fVar118;
            auVar88 = rcpps(auVar98,auVar43);
            fVar78 = auVar88._0_4_;
            fVar143 = auVar88._4_4_;
            fVar144 = auVar88._8_4_;
            fVar145 = auVar88._12_4_;
            fVar146 = (float)DAT_01f7ba10;
            fVar148 = DAT_01f7ba10._4_4_;
            fVar149 = DAT_01f7ba10._12_4_;
            fVar151 = DAT_01f7ba10._8_4_;
            fVar78 = (fVar146 - fVar87 * fVar78) * fVar78 + fVar78;
            fVar143 = (fVar148 - fVar106 * fVar143) * fVar143 + fVar143;
            fVar144 = (fVar151 - fVar115 * fVar144) * fVar144 + fVar144;
            fVar145 = (fVar149 - fVar118 * fVar145) * fVar145 + fVar145;
            local_968[0] = fVar136 * fVar78;
            local_968[1] = fVar113 * fVar143;
            local_968[2] = fVar116 * fVar144;
            local_968[3] = fVar119 * fVar145;
            auVar138._0_4_ = fVar137 * fVar78;
            auVar138._4_4_ = fVar140 * fVar143;
            auVar138._8_4_ = fVar141 * fVar144;
            auVar138._12_4_ = fVar142 * fVar145;
            auVar96 = minps(auVar138,_DAT_01f7ba10);
            auVar124._0_4_ = fVar78 * fVar133;
            auVar124._4_4_ = fVar143 * fVar134;
            auVar124._8_4_ = fVar144 * fVar135;
            auVar124._12_4_ = fVar145 * fVar121;
            auVar88 = minps(auVar124,_DAT_01f7ba10);
            auVar99._0_4_ = fVar146 - auVar96._0_4_;
            auVar99._4_4_ = fVar148 - auVar96._4_4_;
            auVar99._8_4_ = fVar151 - auVar96._8_4_;
            auVar99._12_4_ = fVar149 - auVar96._12_4_;
            auVar112._0_4_ = fVar146 - auVar88._0_4_;
            auVar112._4_4_ = fVar148 - auVar88._4_4_;
            auVar112._8_4_ = fVar151 - auVar88._8_4_;
            auVar112._12_4_ = fVar149 - auVar88._12_4_;
            local_988 = blendvps(auVar96,auVar99,local_928);
            local_978 = blendvps(auVar88,auVar112,local_928);
            local_948 = CONCAT44(fVar130,fVar129);
            uStack_940 = CONCAT44(fVar132,fVar131);
            uVar70 = (ulong)(byte)uVar61;
            do {
              uVar59 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              local_8b8 = *(uint *)(lVar25 + 0x40 + uVar59 * 4);
              puVar62 = (undefined1 *)(ulong)local_8b8;
              pGVar23 = (pSVar66->geometries).items[(long)puVar62].ptr;
              uVar71 = (ulong)*(uint *)(ray + local_bf8 * 4 + 0x90);
              if ((pGVar23->mask & *(uint *)(ray + local_bf8 * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar23->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00281946;
                local_8e8 = *(undefined4 *)(local_988 + uVar59 * 4);
                fVar78 = local_968[uVar59 - 4];
                *(float *)(ray + local_bf8 * 4 + 0x80) = local_968[uVar59];
                args.context = context->user;
                uVar21 = *(undefined4 *)(lVar25 + 0x50 + uVar59 * 4);
                local_8c8._4_4_ = uVar21;
                local_8c8._0_4_ = uVar21;
                local_8c8._8_4_ = uVar21;
                local_8c8._12_4_ = uVar21;
                local_8d8._4_4_ = fVar78;
                local_8d8._0_4_ = fVar78;
                local_8d8._8_4_ = fVar78;
                local_8d8._12_4_ = fVar78;
                uVar21 = *(undefined4 *)(local_958 + uVar59 * 4);
                local_908 = *(undefined4 *)((long)&local_948 + uVar59 * 4);
                local_8f8 = *(undefined4 *)(local_938 + uVar59 * 4);
                local_918[0] = (RTCHitN)(char)uVar21;
                local_918[1] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[2] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[3] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[4] = (RTCHitN)(char)uVar21;
                local_918[5] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[6] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[7] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[8] = (RTCHitN)(char)uVar21;
                local_918[9] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[10] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[0xb] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[0xc] = (RTCHitN)(char)uVar21;
                local_918[0xd] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[0xe] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[0xf] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                uStack_904 = local_908;
                uStack_900 = local_908;
                uStack_8fc = local_908;
                uStack_8f4 = local_8f8;
                uStack_8f0 = local_8f8;
                uStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_ba8 = *local_b78;
                args.valid = (int *)local_ba8;
                args.geometryUserPtr = pGVar23->userPtr;
                args.hit = local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar23->occlusionFilterN)(&args);
                  puVar62 = extraout_RDX;
                }
                if (local_ba8 == (undefined1  [16])0x0) {
                  auVar92._8_4_ = 0xffffffff;
                  auVar92._0_8_ = 0xffffffffffffffff;
                  auVar92._12_4_ = 0xffffffff;
                  auVar92 = auVar92 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var32 = context->args->filter;
                  if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var32)(&args);
                    puVar62 = extraout_RDX_00;
                  }
                  auVar82._0_4_ = -(uint)(local_ba8._0_4_ == 0);
                  auVar82._4_4_ = -(uint)(local_ba8._4_4_ == 0);
                  auVar82._8_4_ = -(uint)(local_ba8._8_4_ == 0);
                  auVar82._12_4_ = -(uint)(local_ba8._12_4_ == 0);
                  auVar92 = auVar82 ^ _DAT_01f7ae20;
                  auVar88 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar82);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar88;
                }
                if ((_DAT_01f7bb20 & auVar92) != (undefined1  [16])0x0) goto LAB_00281946;
                *(float *)(ray + local_bf8 * 4 + 0x80) = fVar104;
                uVar71 = uVar59;
                pSVar66 = scene;
              }
              uVar70 = uVar70 ^ 1L << (uVar59 & 0x3f);
            } while (uVar70 != 0);
            fStack_b14 = *(float *)(ray + local_bf8 * 4);
            fStack_b24 = *(float *)(ray + local_bf8 * 4 + 0x10);
            fStack_b34 = *(float *)(ray + local_bf8 * 4 + 0x20);
            fStack_a0c = *(float *)(ray + local_bf8 * 4 + 0x40);
            fStack_a1c = *(float *)(ray + local_bf8 * 4 + 0x50);
            fVar78 = *(float *)(ray + local_bf8 * 4 + 0x60);
          }
        }
        local_af8 = (float)uVar48;
        fStack_af4 = (float)((ulong)uVar48 >> 0x20);
        fStack_af0 = (float)uVar49;
        local_a98 = (float)uVar44;
        fStack_a94 = (float)((ulong)uVar44 >> 0x20);
        fStack_a90 = (float)uVar45;
        local_a88 = (float)uVar52;
        fStack_a84 = (float)((ulong)uVar52 >> 0x20);
        fStack_a80 = (float)uVar53;
        local_a78 = (float)uVar50;
        fStack_a74 = (float)((ulong)uVar50 >> 0x20);
        fStack_a70 = (float)uVar51;
        local_a68 = (float)uVar46;
        fStack_a64 = (float)((ulong)uVar46 >> 0x20);
        fStack_a60 = (float)uVar47;
        local_b08 = (float)uVar54;
        fStack_b04 = (float)((ulong)uVar54 >> 0x20);
        fStack_b00 = (float)uVar55;
        fVar143 = local_b98 * fVar79 + fVar80 * fVar188;
        fVar144 = local_a98 * fVar79 + local_a68 * fVar188;
        fVar145 = local_af8 * fVar79 + local_a78 * fVar188;
        fVar146 = local_a88 * fVar79 + local_b08 * fVar188;
        fVar80 = fStack_b94 * fVar79 + fVar85 * fVar188;
        fVar85 = fStack_a94 * fVar79 + fStack_a64 * fVar188;
        fVar87 = fStack_af4 * fVar79 + fStack_a74 * fVar188;
        fVar104 = fStack_a84 * fVar79 + fStack_b04 * fVar188;
        fVar118 = fStack_b90 * fVar79 + fVar86 * fVar188;
        fVar129 = fStack_a90 * fVar79 + fStack_a60 * fVar188;
        fStack_b90 = fStack_af0 * fVar79 + fStack_a70 * fVar188;
        fStack_b8c = fStack_a80 * fVar79 + fStack_b00 * fVar188;
        fVar122 = fVar143 - fVar122;
        fVar126 = fVar144 - fVar126;
        fVar127 = fVar145 - fVar127;
        fVar128 = fVar146 - fVar128;
        fVar95 = fVar80 - fVar95;
        fVar101 = fVar85 - fVar101;
        fStack_be0 = fVar87 - fVar102;
        fStack_bdc = fVar104 - fVar103;
        local_b88._0_4_ = fVar118 - (float)local_b88;
        local_b88._4_4_ = fVar129 - local_b88._4_4_;
        fVar148 = fStack_b90 - fStack_b80;
        fVar149 = fStack_b8c - fStack_b7c;
        fVar182 = fVar182 - fVar143;
        fVar184 = fVar184 - fVar144;
        fVar102 = fStack_bb0 - fVar145;
        fVar116 = fStack_bac - fVar146;
        fVar147 = fVar147 - fVar80;
        fVar150 = fVar150 - fVar85;
        fVar153 = fVar153 - fVar87;
        fVar156 = fVar156 - fVar104;
        fVar105 = fVar105 - fVar118;
        fVar114 = fVar114 - fVar129;
        fVar117 = fVar117 - fStack_b90;
        fVar120 = fVar120 - fStack_b8c;
        local_958._0_4_ = fVar147 * (float)local_b88 - fVar105 * fVar95;
        local_958._4_4_ = fVar150 * local_b88._4_4_ - fVar114 * fVar101;
        fStack_950 = fVar153 * fVar148 - fVar117 * fStack_be0;
        fStack_94c = fVar156 * fVar149 - fVar120 * fStack_bdc;
        fVar188 = fVar105 * fVar122 - fVar182 * (float)local_b88;
        fVar86 = fVar114 * fVar126 - fVar184 * local_b88._4_4_;
        fStack_bd0 = fVar117 * fVar127 - fVar102 * fVar148;
        fStack_bcc = fVar120 * fVar128 - fVar116 * fVar149;
        local_938._0_4_ = fVar182 * fVar95 - fVar147 * fVar122;
        local_938._4_4_ = fVar184 * fVar101 - fVar150 * fVar126;
        fStack_930 = fVar102 * fStack_be0 - fVar153 * fVar127;
        fStack_92c = fVar116 * fStack_bdc - fVar156 * fVar128;
        fVar143 = fVar143 - fStack_b14;
        fVar144 = fVar144 - fStack_b14;
        fVar145 = fVar145 - fStack_b14;
        fVar146 = fVar146 - fStack_b14;
        fVar80 = fVar80 - fStack_b24;
        fVar85 = fVar85 - fStack_b24;
        fVar87 = fVar87 - fStack_b24;
        fVar104 = fVar104 - fStack_b24;
        fVar118 = fVar118 - fStack_b34;
        fVar129 = fVar129 - fStack_b34;
        fStack_b90 = fStack_b90 - fStack_b34;
        fStack_b8c = fStack_b8c - fStack_b34;
        fVar103 = fVar80 * fVar78 - fVar118 * fStack_a1c;
        fVar119 = fVar85 * fVar78 - fVar129 * fStack_a1c;
        fVar106 = fVar87 * fVar78 - fStack_b90 * fStack_a1c;
        fVar115 = fVar104 * fVar78 - fStack_b8c * fStack_a1c;
        _local_b98 = CONCAT44(fVar129,fVar118);
        fVar121 = fVar118 * fStack_a0c - fVar143 * fVar78;
        fVar130 = fVar129 * fStack_a0c - fVar144 * fVar78;
        fVar131 = fStack_b90 * fStack_a0c - fVar145 * fVar78;
        fVar132 = fStack_b8c * fStack_a0c - fVar146 * fVar78;
        fVar137 = fVar143 * fStack_a1c - fVar80 * fStack_a0c;
        fVar140 = fVar144 * fStack_a1c - fVar85 * fStack_a0c;
        fVar141 = fVar145 * fStack_a1c - fVar87 * fStack_a0c;
        fVar142 = fVar146 * fStack_a1c - fVar104 * fStack_a0c;
        local_bd8 = CONCAT44(fVar86,fVar188);
        fVar133 = fStack_a0c * (float)local_958._0_4_ +
                  fStack_a1c * fVar188 + fVar78 * (float)local_938._0_4_;
        fVar134 = fStack_a0c * (float)local_958._4_4_ +
                  fStack_a1c * fVar86 + fVar78 * (float)local_938._4_4_;
        fVar135 = fStack_a0c * fStack_950 + fStack_a1c * fStack_bd0 + fVar78 * fStack_930;
        fVar136 = fStack_a0c * fStack_94c + fStack_a1c * fStack_bcc + fVar78 * fStack_92c;
        uVar61 = (uint)fVar133 & 0x80000000;
        uVar175 = (uint)fVar134 & 0x80000000;
        uVar177 = (uint)fVar135 & 0x80000000;
        uVar179 = (uint)fVar136 & 0x80000000;
        fVar78 = (float)((uint)(fVar182 * fVar103 + fVar147 * fVar121 + fVar105 * fVar137) ^ uVar61)
        ;
        fVar113 = (float)((uint)(fVar184 * fVar119 + fVar150 * fVar130 + fVar114 * fVar140) ^
                         uVar175);
        fVar102 = (float)((uint)(fVar102 * fVar106 + fVar153 * fVar131 + fVar117 * fVar141) ^
                         uVar177);
        fVar116 = (float)((uint)(fVar116 * fVar115 + fVar156 * fVar132 + fVar120 * fVar142) ^
                         uVar179);
        fVar95 = (float)((uint)(fVar103 * fVar122 + fVar121 * fVar95 + fVar137 * (float)local_b88) ^
                        uVar61);
        fVar101 = (float)((uint)(fVar119 * fVar126 + fVar130 * fVar101 + fVar140 * local_b88._4_4_)
                         ^ uVar175);
        fVar103 = (float)((uint)(fVar106 * fVar127 + fVar131 * fStack_be0 + fVar141 * fVar148) ^
                         uVar177);
        fVar119 = (float)((uint)(fVar115 * fVar128 + fVar132 * fStack_bdc + fVar142 * fVar149) ^
                         uVar179);
        fVar105 = ABS(fVar133);
        fVar106 = ABS(fVar134);
        fVar114 = ABS(fVar135);
        fVar115 = ABS(fVar136);
        bVar38 = ((0.0 <= fVar95 && 0.0 <= fVar78) && fVar133 != 0.0) && fVar78 + fVar95 <= fVar105;
        auVar91._0_4_ = -(uint)bVar38;
        bVar40 = ((0.0 <= fVar101 && 0.0 <= fVar113) && fVar134 != 0.0) &&
                 fVar113 + fVar101 <= fVar106;
        auVar91._4_4_ = -(uint)bVar40;
        bVar39 = ((0.0 <= fVar103 && 0.0 <= fVar102) && fVar135 != 0.0) &&
                 fVar102 + fVar103 <= fVar114;
        auVar91._8_4_ = -(uint)bVar39;
        bVar37 = ((0.0 <= fVar119 && 0.0 <= fVar116) && fVar136 != 0.0) &&
                 fVar116 + fVar119 <= fVar115;
        auVar91._12_4_ = -(uint)bVar37;
        iVar67 = movmskps((int)uVar71,auVar91);
        if (iVar67 != 0) {
          fVar80 = (float)(uVar61 ^ (uint)(fVar143 * (float)local_958._0_4_ +
                                          fVar80 * fVar188 + fVar118 * (float)local_938._0_4_));
          fVar85 = (float)(uVar175 ^
                          (uint)(fVar144 * (float)local_958._4_4_ +
                                fVar85 * fVar86 + fVar129 * (float)local_938._4_4_));
          fVar86 = (float)(uVar177 ^
                          (uint)(fVar145 * fStack_950 +
                                fVar87 * fStack_bd0 + fStack_b90 * fStack_930));
          fVar87 = (float)(uVar179 ^
                          (uint)(fVar146 * fStack_94c +
                                fVar104 * fStack_bcc + fStack_b8c * fStack_92c));
          fVar188 = *(float *)(ray + local_bf8 * 4 + 0x30);
          bVar33 = fVar188 * fVar105 < fVar80;
          bVar34 = fVar188 * fVar106 < fVar85;
          bVar35 = fVar188 * fVar114 < fVar86;
          bVar36 = fVar188 * fVar115 < fVar87;
          auVar139._4_4_ = -(uint)bVar34;
          auVar139._0_4_ = -(uint)bVar33;
          auVar139._8_4_ = -(uint)bVar35;
          auVar139._12_4_ = -(uint)bVar36;
          fVar188 = *(float *)(ray + local_bf8 * 4 + 0x80);
          auVar83._0_4_ = -(uint)((fVar80 <= fVar188 * fVar105 && bVar33) && bVar38);
          auVar83._4_4_ = -(uint)((fVar85 <= fVar188 * fVar106 && bVar34) && bVar40);
          auVar83._8_4_ = -(uint)((fVar86 <= fVar188 * fVar114 && bVar35) && bVar39);
          auVar83._12_4_ = -(uint)((fVar87 <= fVar188 * fVar115 && bVar36) && bVar37);
          uVar61 = movmskps(iVar67,auVar83);
          if (uVar61 != 0) {
            local_928 = local_888;
            pSVar66 = context->scene;
            auVar42._4_4_ = fVar106;
            auVar42._0_4_ = fVar105;
            auVar42._8_4_ = fVar114;
            auVar42._12_4_ = fVar115;
            auVar88 = rcpps(auVar139,auVar42);
            fVar104 = auVar88._0_4_;
            fVar117 = auVar88._4_4_;
            fVar118 = auVar88._8_4_;
            fVar120 = auVar88._12_4_;
            fVar121 = (float)DAT_01f7ba10;
            fVar122 = DAT_01f7ba10._4_4_;
            fVar126 = DAT_01f7ba10._8_4_;
            fVar127 = DAT_01f7ba10._12_4_;
            fVar104 = (fVar121 - fVar105 * fVar104) * fVar104 + fVar104;
            fVar117 = (fVar122 - fVar106 * fVar117) * fVar117 + fVar117;
            fVar118 = (fVar126 - fVar114 * fVar118) * fVar118 + fVar118;
            fVar120 = (fVar127 - fVar115 * fVar120) * fVar120 + fVar120;
            local_968[0] = fVar80 * fVar104;
            local_968[1] = fVar85 * fVar117;
            local_968[2] = fVar86 * fVar118;
            local_968[3] = fVar87 * fVar120;
            auVar100._0_4_ = fVar78 * fVar104;
            auVar100._4_4_ = fVar113 * fVar117;
            auVar100._8_4_ = fVar102 * fVar118;
            auVar100._12_4_ = fVar116 * fVar120;
            auVar96 = minps(auVar100,_DAT_01f7ba10);
            auVar93._0_4_ = fVar104 * fVar95;
            auVar93._4_4_ = fVar117 * fVar101;
            auVar93._8_4_ = fVar118 * fVar103;
            auVar93._12_4_ = fVar120 * fVar119;
            auVar88 = minps(auVar93,_DAT_01f7ba10);
            auVar125._0_4_ = fVar121 - auVar96._0_4_;
            auVar125._4_4_ = fVar122 - auVar96._4_4_;
            auVar125._8_4_ = fVar126 - auVar96._8_4_;
            auVar125._12_4_ = fVar127 - auVar96._12_4_;
            local_988 = blendvps(auVar96,auVar125,local_888);
            auVar41._4_4_ = fVar122 - auVar88._4_4_;
            auVar41._0_4_ = fVar121 - auVar88._0_4_;
            auVar41._8_4_ = fVar126 - auVar88._8_4_;
            auVar41._12_4_ = fVar127 - auVar88._12_4_;
            local_978 = blendvps(auVar88,auVar41,local_888);
            local_948 = local_bd8;
            uStack_940 = CONCAT44(fStack_bcc,fStack_bd0);
            uVar71 = (ulong)(uVar61 & 0xff);
            do {
              local_b88 = 0;
              if (uVar71 != 0) {
                for (; (uVar71 >> local_b88 & 1) == 0; local_b88 = local_b88 + 1) {
                }
              }
              local_8b8 = *(uint *)(lVar25 + 0x40 + local_b88 * 4);
              puVar62 = (undefined1 *)(ulong)local_8b8;
              pGVar23 = (pSVar66->geometries).items[(long)puVar62].ptr;
              if ((pGVar23->mask & *(uint *)(ray + local_bf8 * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar23->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00281946:
                  *(undefined4 *)(ray + local_bf8 * 4 + 0x80) = 0xff800000;
                  return bVar56;
                }
                local_8e8 = *(undefined4 *)(local_988 + local_b88 * 4);
                fVar78 = local_968[local_b88 - 4];
                *(float *)(ray + local_bf8 * 4 + 0x80) = local_968[local_b88];
                args.context = context->user;
                uVar21 = *(undefined4 *)(lVar25 + 0x50 + local_b88 * 4);
                local_8c8._4_4_ = uVar21;
                local_8c8._0_4_ = uVar21;
                local_8c8._8_4_ = uVar21;
                local_8c8._12_4_ = uVar21;
                local_8d8._4_4_ = fVar78;
                local_8d8._0_4_ = fVar78;
                local_8d8._8_4_ = fVar78;
                local_8d8._12_4_ = fVar78;
                uVar21 = *(undefined4 *)(local_958 + local_b88 * 4);
                local_908 = *(undefined4 *)((long)&local_948 + local_b88 * 4);
                local_8f8 = *(undefined4 *)(local_938 + local_b88 * 4);
                local_918[0] = (RTCHitN)(char)uVar21;
                local_918[1] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[2] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[3] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[4] = (RTCHitN)(char)uVar21;
                local_918[5] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[6] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[7] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[8] = (RTCHitN)(char)uVar21;
                local_918[9] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[10] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[0xb] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                local_918[0xc] = (RTCHitN)(char)uVar21;
                local_918[0xd] = (RTCHitN)(char)((uint)uVar21 >> 8);
                local_918[0xe] = (RTCHitN)(char)((uint)uVar21 >> 0x10);
                local_918[0xf] = (RTCHitN)(char)((uint)uVar21 >> 0x18);
                uStack_904 = local_908;
                uStack_900 = local_908;
                uStack_8fc = local_908;
                uStack_8f4 = local_8f8;
                uStack_8f0 = local_8f8;
                uStack_8ec = local_8f8;
                uStack_8e4 = local_8e8;
                uStack_8e0 = local_8e8;
                uStack_8dc = local_8e8;
                uStack_8b4 = local_8b8;
                uStack_8b0 = local_8b8;
                uStack_8ac = local_8b8;
                local_8a8 = (args.context)->instID[0];
                uStack_8a4 = local_8a8;
                uStack_8a0 = local_8a8;
                uStack_89c = local_8a8;
                local_898 = (args.context)->instPrimID[0];
                uStack_894 = local_898;
                uStack_890 = local_898;
                uStack_88c = local_898;
                local_ba8 = *local_b78;
                args.valid = (int *)local_ba8;
                args.geometryUserPtr = pGVar23->userPtr;
                args.hit = local_918;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar23->occlusionFilterN)(&args);
                  puVar62 = extraout_RDX_01;
                }
                if (local_ba8 == (undefined1  [16])0x0) {
                  auVar94._8_4_ = 0xffffffff;
                  auVar94._0_8_ = 0xffffffffffffffff;
                  auVar94._12_4_ = 0xffffffff;
                  auVar94 = auVar94 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var32 = context->args->filter;
                  if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var32)(&args);
                    puVar62 = extraout_RDX_02;
                  }
                  auVar84._0_4_ = -(uint)(local_ba8._0_4_ == 0);
                  auVar84._4_4_ = -(uint)(local_ba8._4_4_ == 0);
                  auVar84._8_4_ = -(uint)(local_ba8._8_4_ == 0);
                  auVar84._12_4_ = -(uint)(local_ba8._12_4_ == 0);
                  auVar94 = auVar84 ^ _DAT_01f7ae20;
                  auVar88 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar84);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar88;
                }
                if ((_DAT_01f7bb20 & auVar94) != (undefined1  [16])0x0) goto LAB_00281946;
                *(float *)(ray + local_bf8 * 4 + 0x80) = fVar188;
              }
              uVar71 = uVar71 ^ 1L << (local_b88 & 0x3f);
            } while (uVar71 != 0);
          }
        }
        lVar58 = lVar58 + 1;
        fStack_ae0 = fVar79;
        fStack_adc = fVar79;
        fVar78 = local_7f8;
        fVar87 = fStack_7f4;
        fVar95 = fStack_7f0;
        fVar101 = fStack_7ec;
        fVar188 = local_808;
        fVar104 = fStack_804;
        fVar113 = fStack_800;
        fVar102 = fStack_7fc;
        fVar80 = local_818;
        fVar116 = fStack_814;
        fVar103 = fStack_810;
        fVar119 = fStack_80c;
        fVar86 = local_838;
        fVar105 = fStack_834;
        fVar106 = fStack_830;
        fVar114 = fStack_82c;
        fVar79 = local_848;
        fVar115 = fStack_844;
        fVar117 = fStack_840;
        fVar118 = fStack_83c;
        iVar67 = local_858;
        iVar159 = iStack_854;
        iVar160 = iStack_850;
        iVar161 = iStack_84c;
        iVar162 = local_868;
        iVar165 = iStack_864;
        iVar168 = iStack_860;
        iVar171 = iStack_85c;
        fVar85 = local_828;
        fVar120 = fStack_824;
        fVar121 = fStack_820;
        fVar122 = fStack_81c;
      } while (lVar58 != uVar57 - 8);
    }
joined_r0x00281922:
    bVar56 = local_c10 != stack;
    if (!bVar56) {
      return bVar56;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }